

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

void zzMul(word *c,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  word *pwVar8;
  size_t sVar9;
  
  wwSetZero(c,m + n);
  pwVar8 = c;
  for (sVar6 = 0; sVar6 != n; sVar6 = sVar6 + 1) {
    uVar7 = 0;
    for (sVar9 = 0; auVar4._8_8_ = 0, auVar4._0_8_ = uVar7, m != sVar9; sVar9 = sVar9 + 1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = b[sVar9];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = a[sVar6];
      auVar4 = auVar2 * auVar3 + auVar4;
      uVar5 = auVar4._0_8_;
      puVar1 = pwVar8 + sVar9;
      uVar7 = *puVar1;
      *puVar1 = *puVar1 + uVar5;
      uVar7 = auVar4._8_8_ + (ulong)CARRY8(uVar7,uVar5);
    }
    c[sVar6 + m] = uVar7;
    pwVar8 = pwVar8 + 1;
  }
  return;
}

Assistant:

void zzMul(word c[], const word a[], size_t n, const word b[], size_t m, 
	void* stack)
{
	register word carry = 0;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, c, n + m));
	ASSERT(wwIsDisjoint2(b, m, c, n + m));
	wwSetZero(c, n + m);
	for (i = 0; i < n; ++i)
	{
		for (j = 0; j < m; ++j)
		{
			zzMul11(prod, a[i], b[j]);
			prod += carry;
			prod += c[i + j];
			c[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		c[i + j] = carry;
		carry = 0;
	}
	prod = 0;
}